

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

string_view helics::getCleanedTypeName(string_view typeName)

{
  bool bVar1;
  const_reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *in_RSI;
  size_t in_RDI;
  const_iterator dres;
  string strName;
  value_type *res;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>_>
  *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::DataType,_64UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff50;
  allocator<char> *in_stack_ffffffffffffff60;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  local_88;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  local_80;
  undefined4 local_74;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  local_70;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  local_68 [2];
  DataType in_stack_ffffffffffffffac;
  basic_string_view<char,_std::char_traits<char>_> local_49 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  string_view local_10;
  
  local_20._M_len = in_RDI;
  local_20._M_str = in_RSI;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_20);
  if ((!bVar1) &&
     (pvVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front
                         ((basic_string_view<char,_std::char_traits<char>_> *)&local_20),
     *pvVar2 == '[')) {
    local_10._M_str = local_20._M_str;
    local_10._M_len = local_20._M_len;
    return local_10;
  }
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           frozen::
           unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::DataType,64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
           ::find<std::basic_string_view<char,std::char_traits<char>>>
                     (in_stack_ffffffffffffff40,
                      (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff38)
  ;
  local_28 = pbVar3;
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           frozen::
           unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::DataType,_64UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::DataType,_64UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)0x3219e7);
  if (pbVar3 == pbVar4) {
    __t = local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (pbVar3,__t,in_stack_ffffffffffffff60);
    std::allocator<char>::~allocator((allocator<char> *)local_49);
    local_68[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>_>
         ::find(in_stack_ffffffffffffff28,(key_type *)0x321a68);
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>_>
         ::end(in_stack_ffffffffffffff28);
    bVar1 = std::__detail::operator==(local_68,&local_70);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      gmlc::utilities::makeLowerCase(in_stack_ffffffffffffff50);
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               frozen::
               unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::DataType,64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
               ::find<std::__cxx11::string>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      local_28 = pbVar3;
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               frozen::
               unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::DataType,_64UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::DataType,_64UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)0x321b7a);
      if (pbVar3 == pbVar4) {
        local_80._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>_>
             ::find(in_stack_ffffffffffffff28,(key_type *)0x321bd1);
        local_68[0]._M_cur = local_80._M_cur;
        local_88._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>_>
             ::end(in_stack_ffffffffffffff28);
        bVar1 = std::__detail::operator==(local_68,&local_88);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_10._M_str = local_20._M_str;
          local_10._M_len = local_20._M_len;
        }
        else {
          std::__detail::
          _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_false,_true>
          ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_false,_true>
                        *)0x321c1e);
          in_stack_ffffffffffffff30 = typeNameStringRef_abi_cxx11_(in_stack_ffffffffffffffac);
          local_10 = std::__cxx11::string::operator_cast_to_basic_string_view
                               (in_stack_ffffffffffffff30);
        }
      }
      else {
        local_10._M_str = local_20._M_str;
        local_10._M_len = local_20._M_len;
      }
    }
    else {
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_false,_true>
      ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_false,_true>
                    *)0x321aae);
      typeNameStringRef_abi_cxx11_(in_stack_ffffffffffffffac);
      local_10 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30)
      ;
    }
    local_74 = 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff30);
  }
  else {
    local_10._M_str = local_20._M_str;
    local_10._M_len = local_20._M_len;
  }
  return local_10;
}

Assistant:

std::string_view getCleanedTypeName(std::string_view typeName)
{
    if (!typeName.empty() && typeName.front() == '[') {
        return typeName;
    }
    const auto* res = typeMap.find(typeName);
    if (res != typeMap.end()) {
        return typeName;
    }
    std::string strName(typeName);
    auto dres = demangle_names.find(strName);
    if (dres != demangle_names.end()) {
        return typeNameStringRef(dres->second);
    }
    makeLowerCase(strName);
    res = typeMap.find(strName);
    if (res != typeMap.end()) {
        return typeName;
    }
    dres = demangle_names.find(strName);
    if (dres != demangle_names.end()) {
        return typeNameStringRef(dres->second);
    }
    return typeName;
}